

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegdec.c
# Opt level: O3

void my_error_exit(j_common_ptr dinfo)

{
  int iVar1;
  jpeg_error_mgr *pjVar2;
  
  pjVar2 = dinfo->err;
  iVar1 = pjVar2->msg_code;
  fwrite("libjpeg error: ",0xf,1,stderr);
  (*dinfo->err->output_message)(dinfo);
  if ((iVar1 == 0x2c) || (iVar1 == 0x25)) {
    fwrite("`jpegtran -copy all` MAY be able to process this file.\n",0x37,1,stderr);
  }
  longjmp((__jmp_buf_tag *)(pjVar2 + 1),1);
}

Assistant:

static void my_error_exit(j_common_ptr dinfo) {
  struct my_error_mgr* myerr = (struct my_error_mgr*)dinfo->err;
  // The following code is disabled in fuzzing mode because:
  // - the logs can be flooded due to invalid JPEG files
  // - msg_code is wrongfully seen as uninitialized by msan when the libjpeg
  //   dependency is not built with sanitizers enabled
#ifndef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
  const int msg_code = myerr->pub.msg_code;
  fprintf(stderr, "libjpeg error: ");
  dinfo->err->output_message(dinfo);
  if (msg_code == JERR_INPUT_EOF || msg_code == JERR_FILE_READ) {
    fprintf(stderr, "`jpegtran -copy all` MAY be able to process this file.\n");
  }
#endif
  longjmp(myerr->setjmp_buffer, 1);
}